

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O2

bool __thiscall CPubKey::IsFullyValid(CPubKey *this)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  size_t sStack_50;
  secp256k1_pubkey pubkey;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->vch[0];
  if ((bVar1 & 0xfe) == 2) {
    sStack_50 = 0x21;
  }
  else {
    bVar3 = false;
    if ((7 < bVar1) || (bVar3 = false, (0xd0U >> (bVar1 & 0x1f) & 1) == 0)) goto LAB_001db04e;
    if ((bVar1 < 8) && ((0xd0U >> (bVar1 & 0x1f) & 1) != 0)) {
      sStack_50 = 0x41;
    }
    else {
      sStack_50 = 0;
    }
  }
  iVar4 = secp256k1_ec_pubkey_parse(secp256k1_context_static,&pubkey,this->vch,sStack_50);
  bVar3 = iVar4 != 0;
LAB_001db04e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CPubKey::IsFullyValid() const {
    if (!IsValid())
        return false;
    secp256k1_pubkey pubkey;
    return secp256k1_ec_pubkey_parse(secp256k1_context_static, &pubkey, vch, size());
}